

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedTimeZone::getNextTransition
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  UBool UVar1;
  TimeZoneRule *pTStack_50;
  UBool found;
  TimeZoneRule *toRule;
  TimeZoneRule *fromRule;
  UDate transitionTime;
  TimeZoneTransition *pTStack_30;
  UErrorCode status;
  TimeZoneTransition *result_local;
  UDate UStack_20;
  UBool inclusive_local;
  UDate base_local;
  RuleBasedTimeZone *this_local;
  
  transitionTime._4_4_ = U_ZERO_ERROR;
  pTStack_30 = result;
  result_local._7_1_ = inclusive;
  UStack_20 = base;
  base_local = (UDate)this;
  completeConst(this,(UErrorCode *)((long)&transitionTime + 4));
  UVar1 = ::U_FAILURE(transitionTime._4_4_);
  if (UVar1 == '\0') {
    UVar1 = findNext(this,UStack_20,result_local._7_1_,(UDate *)&fromRule,&toRule,
                     &stack0xffffffffffffffb0);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else {
      TimeZoneTransition::setTime(pTStack_30,(UDate)fromRule);
      TimeZoneTransition::setFrom(pTStack_30,toRule);
      TimeZoneTransition::setTo(pTStack_30,pTStack_50);
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    completeConst(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }
    UDate transitionTime;
    TimeZoneRule *fromRule, *toRule;
    UBool found = findNext(base, inclusive, transitionTime, fromRule, toRule);
    if (found) {
        result.setTime(transitionTime);
        result.setFrom((const TimeZoneRule&)*fromRule);
        result.setTo((const TimeZoneRule&)*toRule);
        return TRUE;
    }
    return FALSE;
}